

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  uint uVar3;
  ImGuiColumns *pIVar4;
  bool bVar5;
  char *pcVar6;
  char *label_00;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  float fVar18;
  float fVar19;
  
  uVar9 = 1;
  if (window->Active == false) {
    uVar9 = (ulong)window->WasActive;
  }
  bVar5 = TreeNode(window,"%s \'%s\', %d @ 0x%p",label,window->Name,uVar9,window);
  if (bVar5) {
    uVar3 = window->Flags;
    NodeDrawList(window,window->DrawList,label_00);
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)",
               (double)(window->Pos).x,(double)(window->Pos).y,(double)(window->Size).x,
               (double)(window->Size).y,(double)(window->SizeContents).x,
               (double)(window->SizeContents).y);
    pcVar7 = "Child ";
    if ((uVar3 >> 0x18 & 1) == 0) {
      pcVar7 = "";
    }
    pcVar6 = "Tooltip ";
    if ((uVar3 >> 0x19 & 1) == 0) {
      pcVar6 = "";
    }
    pcVar10 = "Popup ";
    if ((uVar3 >> 0x1a & 1) == 0) {
      pcVar10 = "";
    }
    pcVar11 = "Modal ";
    if ((uVar3 >> 0x1b & 1) == 0) {
      pcVar11 = "";
    }
    pcVar12 = "ChildMenu ";
    if ((uVar3 >> 0x1c & 1) == 0) {
      pcVar12 = "";
    }
    pcVar13 = "NoSavedSettings ";
    if ((uVar3 >> 8 & 1) == 0) {
      pcVar13 = "";
    }
    pcVar15 = "NoMouseInputs";
    if ((uVar3 >> 9 & 1) == 0) {
      pcVar15 = "";
    }
    pcVar17 = "NoNavInputs";
    if ((uVar3 >> 0x12 & 1) == 0) {
      pcVar17 = "";
    }
    pcVar14 = "AlwaysAutoResize";
    if ((uVar3 & 0x40) == 0) {
      pcVar14 = "";
    }
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar3,pcVar7,pcVar6,pcVar10,pcVar11,
               pcVar12,pcVar13,pcVar15,pcVar17,pcVar14);
    fVar18 = (window->SizeContents).x - ((window->SizeFull).x - (window->ScrollbarSizes).x);
    fVar19 = (window->SizeContents).y - ((window->SizeFull).y - (window->ScrollbarSizes).y);
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)",(double)(window->Scroll).x,
               (double)(float)(~-(uint)(fVar18 <= 0.0) & (uint)fVar18),(double)(window->Scroll).y,
               (double)(float)(~-(uint)(fVar19 <= 0.0) & (uint)fVar19));
    if ((window->Active != false) || (uVar9 = 0xffffffff, window->WasActive != false)) {
      uVar9 = (ulong)(uint)(int)window->BeginOrderWithinContext;
    }
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",(ulong)window->Active
               ,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar9);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
               (ulong)window->Appearing,(ulong)window->Hidden,
               (ulong)(uint)window->HiddenFramesCanSkipItems,
               (ulong)(uint)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
    BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
               (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
    if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
      pcVar7 = "NULL";
    }
    else {
      pcVar7 = window->NavLastChildNavWindow->Name;
    }
    BulletText("NavLastChildNavWindow: %s",pcVar7);
    fVar18 = window->NavRectRel[0].Min.x;
    pIVar1 = &window->NavRectRel[0].Max;
    if ((pIVar1->x <= fVar18 && fVar18 != pIVar1->x) ||
       (fVar19 = window->NavRectRel[0].Min.y, pfVar2 = &window->NavRectRel[0].Max.y,
       *pfVar2 <= fVar19 && fVar19 != *pfVar2)) {
      BulletText("NavRectRel[0]: <None>");
    }
    else {
      BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar18,
                 (double)window->NavRectRel[0].Min.y,(double)window->NavRectRel[0].Max.x,
                 (double)window->NavRectRel[0].Max.y);
    }
    if (window->RootWindow != window) {
      NodeWindow(window->RootWindow,"RootWindow");
    }
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      NodeWindow(window->ParentWindow,"ParentWindow");
    }
    if (0 < (window->DC).ChildWindows.Size) {
      NodeWindows(&(window->DC).ChildWindows,"ChildWindows");
    }
    if (0 < (window->ColumnsStorage).Size) {
      bVar5 = TreeNode("Columns","Columns sets (%d)");
      if (bVar5) {
        if (0 < (window->ColumnsStorage).Size) {
          lVar8 = 0;
          do {
            pIVar4 = (window->ColumnsStorage).Data;
            bVar5 = TreeNode((void *)(ulong)pIVar4[lVar8].ID,
                             "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                             (void *)(ulong)pIVar4[lVar8].ID,(ulong)(uint)pIVar4[lVar8].Count,
                             (ulong)(uint)pIVar4[lVar8].Flags);
            if (bVar5) {
              BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",
                         (double)(pIVar4[lVar8].MaxX - pIVar4[lVar8].MinX),
                         (double)pIVar4[lVar8].MinX,(double)pIVar4[lVar8].MaxX);
              if (0 < pIVar4[lVar8].Columns.Size) {
                lVar16 = 0;
                uVar9 = 0;
                do {
                  fVar18 = *(float *)((long)&(pIVar4[lVar8].Columns.Data)->OffsetNorm + lVar16);
                  BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)fVar18,
                             (double)((pIVar4[lVar8].MaxX - pIVar4[lVar8].MinX) * fVar18),
                             uVar9 & 0xffffffff);
                  uVar9 = uVar9 + 1;
                  lVar16 = lVar16 + 0x1c;
                } while ((long)uVar9 < (long)pIVar4[lVar8].Columns.Size);
              }
              TreePop();
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (window->ColumnsStorage).Size);
        }
        TreePop();
      }
    }
    BulletText("Storage: %d bytes",(ulong)(uint)((window->StateStorage).Data.Size << 4));
    TreePop();
    return;
  }
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, GetWindowScrollMaxX(window), window->Scroll.y, GetWindowScrollMaxY(window));
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
            ImGui::TreePop();
        }